

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrappeTorsionType.hpp
# Opt level: O0

void __thiscall
OpenMD::TrappeTorsionType::TrappeTorsionType
          (TrappeTorsionType *this,RealType c0,RealType c1,RealType c2,RealType c3,bool trans180)

{
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  RealType b3;
  RealType b2;
  RealType b1;
  RealType b0;
  int power;
  PolynomialTorsionType *in_stack_ffffffffffffffa0;
  PolynomialTorsionType *in_stack_ffffffffffffffb0;
  
  PolynomialTorsionType::PolynomialTorsionType(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__TrappeTorsionType_005028a0;
  in_RDI[7] = in_XMM0_Qa;
  in_RDI[8] = in_XMM1_Qa;
  in_RDI[9] = in_XMM2_Qa;
  in_RDI[10] = in_XMM3_Qa;
  PolynomialTorsionType::setCoefficient
            (in_stack_ffffffffffffffa0,(int)((ulong)in_RDI >> 0x20),1.46156673241599e-317);
  power = (int)((ulong)in_RDI >> 0x20);
  PolynomialTorsionType::setCoefficient(in_stack_ffffffffffffffa0,power,1.4615776018602e-317);
  PolynomialTorsionType::setCoefficient(in_stack_ffffffffffffffa0,power,1.46158847130441e-317);
  PolynomialTorsionType::setCoefficient(in_stack_ffffffffffffffa0,power,1.46159934074862e-317);
  return;
}

Assistant:

TrappeTorsionType(RealType c0, RealType c1, RealType c2, RealType c3,
                      bool trans180) :
        PolynomialTorsionType(),
        c0_(c0), c1_(c1), c2_(c2), c3_(c3) {
      // convert Trappe Torsion Type to Polynomial Torsion type

      RealType b0 = c0 + c1 + 2.0 * c2 + c3;
      RealType b1 = c1 - 3.0 * c3;
      RealType b2 = -2.0 * c2;
      RealType b3 = 4.0 * c3;

      if (!trans180) {
        b1 = -b1;
        b3 = -b3;
      }

      setCoefficient(0, b0);
      setCoefficient(1, b1);
      setCoefficient(2, b2);
      setCoefficient(3, b3);
    }